

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  size_t *psVar1;
  
  (this->assertions).passed = (this->assertions).passed + (other->assertions).passed;
  psVar1 = &(this->assertions).failed;
  *psVar1 = *psVar1 + (other->assertions).failed;
  psVar1 = &(this->assertions).failedButOk;
  *psVar1 = *psVar1 + (other->assertions).failedButOk;
  (this->testCases).passed = (this->testCases).passed + (other->testCases).passed;
  psVar1 = &(this->testCases).failed;
  *psVar1 = *psVar1 + (other->testCases).failed;
  psVar1 = &(this->testCases).failedButOk;
  *psVar1 = *psVar1 + (other->testCases).failedButOk;
  return this;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }